

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t u_strCaseCompare_63(UChar *s1,int32_t length1,UChar *s2,int32_t length2,uint32_t options,
                           UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *pErrorCode_local;
  uint32_t options_local;
  int32_t length2_local;
  UChar *s2_local;
  int32_t length1_local;
  UChar *s1_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if ((s1 != (UChar *)0x0) && (((-2 < length1 && (s2 != (UChar *)0x0)) && (-2 < length2)))) {
    iVar2 = u_strcmpFold_63(s1,length1,s2,length2,options | 0x10000,pErrorCode);
    return iVar2;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_strCaseCompare(const UChar *s1, int32_t length1,
                 const UChar *s2, int32_t length2,
                 uint32_t options,
                 UErrorCode *pErrorCode) {
    /* argument checking */
    if(pErrorCode==0 || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s1==NULL || length1<-1 || s2==NULL || length2<-1) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    return u_strcmpFold(s1, length1, s2, length2,
                        options|U_COMPARE_IGNORE_CASE,
                        pErrorCode);
}